

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14PrivateFunctionMapFactory.cpp
# Opt level: O2

ElementFunctionMap * COLLADASaxFWL14::FunctionMapFactory::createFunctionMap__COLLADA__1level(void)

{
  int iVar1;
  mapped_type *pmVar2;
  
  if (createFunctionMap__COLLADA__1level()::functionMap == '\0') {
    iVar1 = __cxa_guard_acquire(&createFunctionMap__COLLADA__1level()::functionMap);
    if (iVar1 != 0) {
      createFunctionMap__COLLADA__1level::functionMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      createFunctionMap__COLLADA__1level::functionMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      createFunctionMap__COLLADA__1level::functionMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = &createFunctionMap__COLLADA__1level::functionMap._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
      createFunctionMap__COLLADA__1level::functionMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = &createFunctionMap__COLLADA__1level::functionMap._M_t._M_impl.super__Rb_tree_header
                  ._M_header;
      createFunctionMap__COLLADA__1level::functionMap._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      __cxa_atexit(std::
                   map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                   ::~map,&createFunctionMap__COLLADA__1level::functionMap,&__dso_handle);
      __cxa_guard_release(&createFunctionMap__COLLADA__1level()::functionMap);
    }
  }
  if (createFunctionMap__COLLADA__1level()::mapFilled == '\0') {
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,&HASH_ELEMENT_COLLADA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__COLLADA;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__COLLADA;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__COLLADA;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__COLLADA;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__COLLADA;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__COLLADA;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,&HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,&HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_ANIMATION_CLIPS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_animation_clips;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_animation_clips;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_animation_clips;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_animation_clips;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_animation_clips;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_animation_clips;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_ANIMATIONS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_animations;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_animations;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_animations;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_animations;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_animations;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_animations;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_CAMERAS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_cameras;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_cameras;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_cameras;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__library_cameras;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_cameras;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__library_cameras;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_CONTROLLERS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_controllers;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_controllers;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_controllers;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_controllers;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_controllers;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_controllers;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_EFFECTS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_effects;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_effects;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_effects;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__library_effects;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_effects;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__library_effects;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_FORCE_FIELDS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_force_fields;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_force_fields;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_force_fields;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_force_fields;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_force_fields
    ;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_force_fields;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_GEOMETRIES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_geometries;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_geometries;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_geometries;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_geometries;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_geometries;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_geometries;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_IMAGES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_images;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_images;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_images
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__library_images;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_images;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__library_images;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_LIGHTS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_lights;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_lights;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_lights
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__library_lights;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_lights;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__library_lights;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_MATERIALS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_materials;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_materials;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_materials;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_materials;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_materials;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_materials;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_NODES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_nodes;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_nodes;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_nodes;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__library_nodes;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__library_nodes;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__library_nodes;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_PHYSICS_MATERIALS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_physics_materials;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_physics_materials;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_physics_materials;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_physics_materials;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_physics_materials;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_physics_materials;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_PHYSICS_MODELS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_PHYSICS_SCENES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_physics_scenes;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_physics_scenes;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_physics_scenes;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_physics_scenes;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_physics_scenes;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_physics_scenes;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,
                          &HASH_ELEMENT_LIBRARY_VISUAL_SCENES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_visual_scenes;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_visual_scenes;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_visual_scenes;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_visual_scenes;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_visual_scenes;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_visual_scenes;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,&HASH_ELEMENT_SCENE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__scene;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__scene;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__scene;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__scene;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__scene;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__scene;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    createFunctionMap__COLLADA__1level()::mapFilled = '\x01';
  }
  return &createFunctionMap__COLLADA__1level::functionMap;
}

Assistant:

const ColladaParserAutoGen14Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__COLLADA__1level() {
static ColladaParserAutoGen14Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__COLLADA, &ColladaParserAutoGen14Private::_data__COLLADA, &ColladaParserAutoGen14Private::_end__COLLADA, &ColladaParserAutoGen14Private::_preBegin__COLLADA, &ColladaParserAutoGen14Private::_preEnd__COLLADA, &ColladaParserAutoGen14Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__asset, &ColladaParserAutoGen14Private::_data__asset, &ColladaParserAutoGen14Private::_end__asset, &ColladaParserAutoGen14Private::_preBegin__asset, &ColladaParserAutoGen14Private::_preEnd__asset, &ColladaParserAutoGen14Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__extra, &ColladaParserAutoGen14Private::_data__extra, &ColladaParserAutoGen14Private::_end__extra, &ColladaParserAutoGen14Private::_preBegin__extra, &ColladaParserAutoGen14Private::_preEnd__extra, &ColladaParserAutoGen14Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_LIBRARY_ANIMATION_CLIPS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_animation_clips, &ColladaParserAutoGen14Private::_data__library_animation_clips, &ColladaParserAutoGen14Private::_end__library_animation_clips, &ColladaParserAutoGen14Private::_preBegin__library_animation_clips, &ColladaParserAutoGen14Private::_preEnd__library_animation_clips, &ColladaParserAutoGen14Private::_freeAttributes__library_animation_clips);
functionMap[HASH_ELEMENT_LIBRARY_ANIMATIONS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_animations, &ColladaParserAutoGen14Private::_data__library_animations, &ColladaParserAutoGen14Private::_end__library_animations, &ColladaParserAutoGen14Private::_preBegin__library_animations, &ColladaParserAutoGen14Private::_preEnd__library_animations, &ColladaParserAutoGen14Private::_freeAttributes__library_animations);
functionMap[HASH_ELEMENT_LIBRARY_CAMERAS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_cameras, &ColladaParserAutoGen14Private::_data__library_cameras, &ColladaParserAutoGen14Private::_end__library_cameras, &ColladaParserAutoGen14Private::_preBegin__library_cameras, &ColladaParserAutoGen14Private::_preEnd__library_cameras, &ColladaParserAutoGen14Private::_freeAttributes__library_cameras);
functionMap[HASH_ELEMENT_LIBRARY_CONTROLLERS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_controllers, &ColladaParserAutoGen14Private::_data__library_controllers, &ColladaParserAutoGen14Private::_end__library_controllers, &ColladaParserAutoGen14Private::_preBegin__library_controllers, &ColladaParserAutoGen14Private::_preEnd__library_controllers, &ColladaParserAutoGen14Private::_freeAttributes__library_controllers);
functionMap[HASH_ELEMENT_LIBRARY_EFFECTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_effects, &ColladaParserAutoGen14Private::_data__library_effects, &ColladaParserAutoGen14Private::_end__library_effects, &ColladaParserAutoGen14Private::_preBegin__library_effects, &ColladaParserAutoGen14Private::_preEnd__library_effects, &ColladaParserAutoGen14Private::_freeAttributes__library_effects);
functionMap[HASH_ELEMENT_LIBRARY_FORCE_FIELDS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_force_fields, &ColladaParserAutoGen14Private::_data__library_force_fields, &ColladaParserAutoGen14Private::_end__library_force_fields, &ColladaParserAutoGen14Private::_preBegin__library_force_fields, &ColladaParserAutoGen14Private::_preEnd__library_force_fields, &ColladaParserAutoGen14Private::_freeAttributes__library_force_fields);
functionMap[HASH_ELEMENT_LIBRARY_GEOMETRIES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_geometries, &ColladaParserAutoGen14Private::_data__library_geometries, &ColladaParserAutoGen14Private::_end__library_geometries, &ColladaParserAutoGen14Private::_preBegin__library_geometries, &ColladaParserAutoGen14Private::_preEnd__library_geometries, &ColladaParserAutoGen14Private::_freeAttributes__library_geometries);
functionMap[HASH_ELEMENT_LIBRARY_IMAGES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_images, &ColladaParserAutoGen14Private::_data__library_images, &ColladaParserAutoGen14Private::_end__library_images, &ColladaParserAutoGen14Private::_preBegin__library_images, &ColladaParserAutoGen14Private::_preEnd__library_images, &ColladaParserAutoGen14Private::_freeAttributes__library_images);
functionMap[HASH_ELEMENT_LIBRARY_LIGHTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_lights, &ColladaParserAutoGen14Private::_data__library_lights, &ColladaParserAutoGen14Private::_end__library_lights, &ColladaParserAutoGen14Private::_preBegin__library_lights, &ColladaParserAutoGen14Private::_preEnd__library_lights, &ColladaParserAutoGen14Private::_freeAttributes__library_lights);
functionMap[HASH_ELEMENT_LIBRARY_MATERIALS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_materials, &ColladaParserAutoGen14Private::_data__library_materials, &ColladaParserAutoGen14Private::_end__library_materials, &ColladaParserAutoGen14Private::_preBegin__library_materials, &ColladaParserAutoGen14Private::_preEnd__library_materials, &ColladaParserAutoGen14Private::_freeAttributes__library_materials);
functionMap[HASH_ELEMENT_LIBRARY_NODES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_nodes, &ColladaParserAutoGen14Private::_data__library_nodes, &ColladaParserAutoGen14Private::_end__library_nodes, &ColladaParserAutoGen14Private::_preBegin__library_nodes, &ColladaParserAutoGen14Private::_preEnd__library_nodes, &ColladaParserAutoGen14Private::_freeAttributes__library_nodes);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_MATERIALS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_materials, &ColladaParserAutoGen14Private::_data__library_physics_materials, &ColladaParserAutoGen14Private::_end__library_physics_materials, &ColladaParserAutoGen14Private::_preBegin__library_physics_materials, &ColladaParserAutoGen14Private::_preEnd__library_physics_materials, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_materials);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_MODELS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_models, &ColladaParserAutoGen14Private::_data__library_physics_models, &ColladaParserAutoGen14Private::_end__library_physics_models, &ColladaParserAutoGen14Private::_preBegin__library_physics_models, &ColladaParserAutoGen14Private::_preEnd__library_physics_models, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_models);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_SCENES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_scenes, &ColladaParserAutoGen14Private::_data__library_physics_scenes, &ColladaParserAutoGen14Private::_end__library_physics_scenes, &ColladaParserAutoGen14Private::_preBegin__library_physics_scenes, &ColladaParserAutoGen14Private::_preEnd__library_physics_scenes, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_scenes);
functionMap[HASH_ELEMENT_LIBRARY_VISUAL_SCENES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_visual_scenes, &ColladaParserAutoGen14Private::_data__library_visual_scenes, &ColladaParserAutoGen14Private::_end__library_visual_scenes, &ColladaParserAutoGen14Private::_preBegin__library_visual_scenes, &ColladaParserAutoGen14Private::_preEnd__library_visual_scenes, &ColladaParserAutoGen14Private::_freeAttributes__library_visual_scenes);
functionMap[HASH_ELEMENT_SCENE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__scene, &ColladaParserAutoGen14Private::_data__scene, &ColladaParserAutoGen14Private::_end__scene, &ColladaParserAutoGen14Private::_preBegin__scene, &ColladaParserAutoGen14Private::_preEnd__scene, &ColladaParserAutoGen14Private::_freeAttributes__scene);
mapFilled = true;
}
return functionMap;
}